

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O1

string * __thiscall
deqp::gls::DrawTestSpec::getName_abi_cxx11_(string *__return_storage_ptr__,DrawTestSpec *this)

{
  uint uVar1;
  string *psVar2;
  long lVar3;
  ostream *poVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  pointer pAVar8;
  bool bVar9;
  stringstream name;
  allocator<char> local_219;
  DrawTestSpec *local_218;
  long *local_210;
  long local_208;
  long local_200 [2];
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  ulong local_1d0;
  ulong local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1c8 = (ulong)*(uint *)(gls::(anonymous_namespace)::
                               getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
                              (long)(int)this->drawMethod * 6);
  local_1d0 = (ulong)*(ushort *)
                      (gls::(anonymous_namespace)::
                       getMethodInfo(deqp::gls::DrawTestSpec::DrawMethod)::infos +
                      (long)(int)this->drawMethod * 6 + 4);
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  pAVar8 = (this->attribs).
           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(this->attribs).
                super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar8;
  local_218 = this;
  if (lVar3 != 0) {
    bVar9 = 1 < (ulong)((lVar3 >> 3) * -0x3333333333333333);
    lVar3 = 0;
    uVar6 = 0;
    do {
      if (bVar9) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"attrib",6);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
      }
      pcVar7 = "pos_";
      if ((uVar6 != 0) && (pcVar7 = "col_", (&pAVar8->additionalPositionAttribute)[lVar3] != false))
      {
        pcVar7 = "pos_";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,4);
      if ((&pAVar8->useDefaultAttribute)[lVar3] == true) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"non_array_",10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,
                   inputTypeToString::types[*(int *)((long)&pAVar8->inputType + lVar3)],
                   (allocator<char> *)&local_210);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
        poVar4 = (ostream *)
                 std::ostream::operator<<(poVar4,*(int *)((long)&pAVar8->componentCount + lVar3));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,
                   outputTypeToString::types[*(int *)((long)&pAVar8->outputType + lVar3)],&local_219
                  );
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_210,local_208);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,
                   storageToString::storages[*(int *)((long)&pAVar8->storage + lVar3)],
                   (allocator<char> *)&local_210);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)((long)&pAVar8->offset + lVar3))
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(int *)((long)&pAVar8->stride + lVar3))
        ;
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,
                   inputTypeToString::types[*(int *)((long)&pAVar8->inputType + lVar3)],&local_219);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_210,local_208);
        if (local_210 != local_200) {
          operator_delete(local_210,local_200[0] + 1);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        if ((*(uint *)((long)&pAVar8->inputType + lVar3) & 0xfffffffe) != 10) {
          std::ostream::operator<<
                    ((ostream *)local_1a8,*(int *)((long)&pAVar8->componentCount + lVar3));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
        bVar9 = (&pAVar8->normalize)[lVar3] != false;
        pcVar7 = glcts::fixed_sample_locations_values + 1;
        if (bVar9) {
          pcVar7 = "normalized_";
        }
        lVar5 = 0;
        if (bVar9) {
          lVar5 = 0xb;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,lVar5);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f0,
                   outputTypeToString::types[*(int *)((long)&pAVar8->outputType + lVar3)],
                   (allocator<char> *)&local_210);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_210,
                   usageTypeToString::usages[*(int *)((long)&pAVar8->usage + lVar3)],&local_219);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,(char *)local_210,local_208);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
        poVar4 = (ostream *)
                 std::ostream::operator<<(poVar4,*(int *)((long)&pAVar8->instanceDivisor + lVar3));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
      }
      if (local_210 != local_200) {
        operator_delete(local_210,local_200[0] + 1);
      }
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      uVar6 = uVar6 + 1;
      pAVar8 = (local_218->attribs).
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x28;
      bVar9 = true;
    } while (uVar6 < (ulong)(((long)(local_218->attribs).
                                    super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar8 >> 3)
                            * -0x3333333333333333));
  }
  psVar2 = local_1c0;
  uVar6 = local_1c8;
  if ((local_1c8 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"index_",6);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f0,indexTypeToString::indexTypes[(int)local_218->indexType],
               (allocator<char> *)&local_210);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(char *)local_1f0,local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,storageToString::storages[(int)local_218->indexStorage],
               &local_219);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_210,local_208);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"offset",6);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_218->indexPointerOffset);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if (local_1f0 != local_1e0) {
      operator_delete(local_1f0,local_1e0[0] + 1);
    }
  }
  uVar1 = (uint)uVar6;
  if ((uVar1 >> 0x18 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"first",5);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_218->first);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
  }
  if ((uVar1 >> 0x10 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ranged_",7);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_218->indexMin);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_218->indexMax);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
  }
  if ((uVar1 >> 8 & 1) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"instances",9);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_218->instanceCount);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_",1);
  }
  uVar6 = (ulong)local_218->primitive;
  if (uVar6 < 0xb) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,&DAT_01cf23e8 + *(int *)(&DAT_01cf23e8 + uVar6 * 4),
               *(long *)(&DAT_01cf2418 + uVar6 * 8));
  }
  std::ostream::operator<<(local_1a8,local_218->primitiveCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string DrawTestSpec::getName (void) const
{
	const MethodInfo	methodInfo	= getMethodInfo(drawMethod);
	const bool			hasFirst	= methodInfo.first;
	const bool			instanced	= methodInfo.instanced;
	const bool			ranged		= methodInfo.ranged;
	const bool			indexed		= methodInfo.indexed;

	std::stringstream name;

	for (size_t ndx = 0; ndx < attribs.size(); ++ndx)
	{
		const AttributeSpec& attrib = attribs[ndx];

		if (attribs.size() > 1)
			name << "attrib" << ndx << "_";

		if (ndx == 0|| attrib.additionalPositionAttribute)
			name << "pos_";
		else
			name << "col_";

		if (attrib.useDefaultAttribute)
		{
			name
				<< "non_array_"
				<< DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "_"
				<< attrib.componentCount << "_"
				<< DrawTestSpec::outputTypeToString(attrib.outputType) << "_";
		}
		else
		{
			name
				<< DrawTestSpec::storageToString(attrib.storage) << "_"
				<< attrib.offset << "_"
				<< attrib.stride << "_"
				<< DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType);
			if (attrib.inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 && attrib.inputType != DrawTestSpec::INPUTTYPE_INT_2_10_10_10)
				name << attrib.componentCount;
			name
				<< "_"
				<< (attrib.normalize ? "normalized_" : "")
				<< DrawTestSpec::outputTypeToString(attrib.outputType) << "_"
				<< DrawTestSpec::usageTypeToString(attrib.usage) << "_"
				<< attrib.instanceDivisor << "_";
		}
	}

	if (indexed)
		name
			<< "index_" << DrawTestSpec::indexTypeToString(indexType) << "_"
			<< DrawTestSpec::storageToString(indexStorage) << "_"
			<< "offset" << indexPointerOffset << "_";
	if (hasFirst)
		name << "first" << first << "_";
	if (ranged)
		name << "ranged_" << indexMin << "_" << indexMax << "_";
	if (instanced)
		name << "instances" << instanceCount << "_";

	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:
			name << "points_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:
			name << "triangles_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
			name << "triangle_fan_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
			name << "triangle_strip_";
			break;
		case DrawTestSpec::PRIMITIVE_LINES:
			name << "lines_";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:
			name << "line_strip_";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:
			name << "line_loop_";
			break;
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
			name << "line_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			name << "line_strip_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
			name << "triangles_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			name << "triangle_strip_adjancency";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	name << primitiveCount;

	return name.str();
}